

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreensurface.cpp
# Opt level: O1

void * __thiscall
QOffscreenSurface::resolveInterface(QOffscreenSurface *this,char *name,int revision)

{
  return (void *)0x0;
}

Assistant:

void *QOffscreenSurface::resolveInterface(const char *name, int revision) const
{
    Q_UNUSED(name); Q_UNUSED(revision);

    Q_D(const QOffscreenSurface);
    Q_UNUSED(d);

#if defined(Q_OS_ANDROID)
    QT_NATIVE_INTERFACE_RETURN_IF(QAndroidOffscreenSurface, d->platformOffscreenSurface);
#endif

    return nullptr;
}